

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O3

wchar_t sftp_cmd_close(sftp_command *cmd)

{
  _Bool _Var1;
  char ch;
  char local_1;
  
  if (backend == (Backend *)0x0) {
    puts("psftp: not connected to a host; use \"open host.name\"");
  }
  else {
    _Var1 = (*backend->vt->connected)(backend);
    if (_Var1) {
      (*backend->vt->special)(backend,SS_EOF,0);
      sent_eof = 1;
      sftp_recvdata(&local_1,1);
    }
    do_sftp_cleanup();
  }
  return L'\0';
}

Assistant:

int sftp_cmd_close(struct sftp_command *cmd)
{
    if (!backend) {
        not_connected();
        return 0;
    }

    if (backend_connected(backend)) {
        char ch;
        backend_special(backend, SS_EOF, 0);
        sent_eof = true;
        sftp_recvdata(&ch, 1);
    }
    do_sftp_cleanup();

    return 0;
}